

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O1

bid_t docio_append_doc_raw(docio_handle *handle,uint64_t size,void *buf)

{
  ushort uVar1;
  bid_t bVar2;
  filemgr_magic_t magic;
  undefined1 auVar3 [16];
  int iVar4;
  fdb_status fVar5;
  uint64_t uVar6;
  bid_t bVar7;
  bid_t bVar8;
  bid_t bVar9;
  ulong uVar10;
  ulong uVar11;
  docio_handle *pdVar12;
  undefined8 *puVar13;
  ulong *puVar14;
  undefined1 *puVar15;
  undefined8 *puVar16;
  uint uVar17;
  long lVar18;
  filemgr *pfVar19;
  err_log_callback *peVar20;
  undefined1 *puVar21;
  uint uVar22;
  ulong uVar23;
  size_t sVar24;
  char *pcVar25;
  uint uVar26;
  void *pvVar27;
  ulong uVar28;
  ulong uVar29;
  bid_t bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  bid_t abStack_110 [3];
  ulong uStack_f8;
  bid_t bStack_f0;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  bid_t local_c0;
  bid_t end;
  bid_t local_b0;
  bid_t begin;
  ulong local_a0;
  undefined1 local_98 [15];
  undefined1 uStack_89;
  void *local_80;
  bid_t local_78;
  ulong *local_70;
  err_log_callback *local_68;
  docio_handle *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  undefined1 local_32;
  char local_31;
  uint8_t marker [1];
  long lVar35;
  
  peVar20 = handle->log_callback;
  uVar17 = handle->file->blocksize;
  uVar23 = (ulong)uVar17;
  uStack_e0 = 0x127210;
  local_80 = buf;
  local_31 = ver_non_consecutive_doc(handle->file->version);
  local_98 = SUB1615((undefined1  [16])0x0,0);
  uStack_89 = 0xdd;
  uVar26 = (uint)(byte)local_31;
  local_32 = 0xdd;
  if (handle->curblock == 0xffffffffffffffff) {
    uStack_e0 = 0x127242;
    uVar6 = filemgr_get_sb_bmp_revnum(handle->file);
    handle->cur_bmp_revnum_hash = (uint16_t)uVar6;
    uStack_e0 = 0x127252;
    bVar7 = filemgr_alloc(handle->file,peVar20);
    handle->curblock = bVar7;
    handle->curpos = 0;
  }
  uVar11 = ((ulong)(uVar26 - 1) | 0xfffffffffffffff0) + uVar23;
  uStack_e0 = 0x12726d;
  iVar4 = filemgr_is_writable(handle->file,handle->curblock);
  if (iVar4 == 0) {
    uVar26 = handle->curpos;
    if (uVar26 < uVar17) {
      uStack_e0 = 0x127293;
      filemgr_mark_stale(handle->file,handle->curblock * uVar23 + (ulong)uVar26,uVar11 - uVar26);
    }
    uStack_e0 = 0x12729b;
    uVar6 = filemgr_get_sb_bmp_revnum(handle->file);
    handle->cur_bmp_revnum_hash = (uint16_t)uVar6;
    uStack_e0 = 0x1272ab;
    bVar7 = filemgr_alloc(handle->file,peVar20);
    handle->curblock = bVar7;
    handle->curpos = 0;
  }
  local_78 = uVar23;
  local_98._8_2_ = handle->cur_bmp_revnum_hash << 8 | handle->cur_bmp_revnum_hash >> 8;
  local_60 = handle;
  uVar23 = (ulong)handle->curpos;
  local_48 = uVar11;
  if (uVar11 - uVar23 < size) {
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar11;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = size;
    local_50 = SUB168(auVar3 / auVar36,0);
    iVar4 = SUB164(auVar3 / auVar36,0);
    local_70 = (ulong *)(local_d8 + -((ulong)(iVar4 + 1) * 8 + 0xf & 0xfffffffffffffff0));
    bVar7 = (long)(local_d8 + -((ulong)(iVar4 + 1) * 8 + 0xf & 0xfffffffffffffff0)) -
            ((ulong)(iVar4 + 1) * 2 + 0xf & 0xfffffffffffffff0);
    end = bVar7;
    uVar17 = (int)uVar11 - handle->curpos;
    uVar26 = (uint)(size % uVar11);
    if (local_31 == '\0') {
      pfVar19 = handle->file;
      bVar8 = handle->curblock;
      *(undefined8 *)(bVar7 - 8) = 0x127475;
      bVar9 = filemgr_alloc_multiple_cond
                        (pfVar19,bVar8 + 1,iVar4 + (uint)(uVar17 < uVar26),&local_b0,&local_c0,
                         peVar20);
      uVar23 = local_48;
      bVar30 = local_78;
      bVar2 = handle->curblock;
      bVar8 = bVar2 + 1;
      if (bVar9 == bVar8) {
        pfVar19 = handle->file;
        if (local_b0 != bVar8) {
          sVar24 = 0x161;
          fVar5 = FDB_RESULT_SUCCESS;
          *(char **)(bVar7 - 0x10) = pfVar19->filename;
          *(bid_t *)(bVar7 - 0x18) = bVar8;
          puVar16 = (undefined8 *)(bVar7 - 0x20);
          *(char **)(bVar7 - 0x20) =
               "Error in allocating blocks starting from block id %lu in a database file \'%s\'";
          goto LAB_00127be6;
        }
        *(err_log_callback **)(bVar7 - 0x10) = peVar20;
        *(undefined8 *)(bVar7 - 0x18) = 0x1274b8;
        fVar5 = filemgr_write_offset
                          (pfVar19,bVar2,uVar23,1,&local_32,false,
                           *(err_log_callback **)(bVar7 - 0x10));
        pvVar27 = local_80;
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfVar19 = handle->file;
          puVar13 = (undefined8 *)(bVar7 - 8);
          sVar24 = 0x16b;
          goto LAB_00127542;
        }
        local_40 = (ulong)uVar17;
        if (uVar17 != 0) {
          pfVar19 = handle->file;
          bVar8 = handle->curblock;
          uVar26 = handle->curpos;
          *(err_log_callback **)(bVar7 - 0x10) = peVar20;
          *(undefined8 *)(bVar7 - 0x18) = 0x127c35;
          fVar5 = filemgr_write_offset
                            (pfVar19,bVar8,(ulong)uVar26,(ulong)uVar17,pvVar27,true,
                             *(err_log_callback **)(bVar7 - 0x10));
          if (fVar5 != FDB_RESULT_SUCCESS) {
            sVar24 = 0x177;
            *(char **)(bVar7 - 0x10) = handle->file->filename;
            *(uint64_t *)(bVar7 - 0x18) = size;
            puVar14 = (ulong *)(bVar7 - 0x20);
            *(ulong *)(bVar7 - 0x20) = local_40;
            goto LAB_001275bb;
          }
        }
        size = size - uVar17;
        bVar30 = bVar30 * handle->curblock + (ulong)handle->curpos;
        uVar23 = local_40;
      }
      else {
        if ((bVar2 != 0xffffffffffffffff) && (uVar17 = handle->curpos, uVar17 < (uint)local_78)) {
          pfVar19 = handle->file;
          lVar18 = bVar2 * local_78;
          sVar24 = local_48 - uVar17;
          *(undefined8 *)(bVar7 - 8) = 0x1275f9;
          filemgr_mark_stale(pfVar19,lVar18 + (ulong)uVar17,sVar24);
        }
        pfVar19 = handle->file;
        iVar4 = (int)local_50;
        *(undefined8 *)(bVar7 - 8) = 0x127620;
        filemgr_alloc_multiple
                  (pfVar19,(iVar4 + 1) - (uint)(uVar26 == 0),&local_b0,&local_c0,peVar20);
        bVar30 = bVar30 * local_b0;
        uVar23 = 0;
      }
      uVar29 = local_c0 - local_b0;
      uVar11 = uVar29 + 1;
      local_78 = bVar30;
      if (uVar11 != 0) {
        auVar33._8_4_ = (int)uVar29;
        auVar33._0_8_ = uVar29;
        auVar33._12_4_ = (int)(uVar29 >> 0x20);
        lVar18 = 0;
        auVar33 = auVar33 ^ _DAT_00157d60;
        auVar34 = _DAT_00157d50;
        do {
          auVar36 = auVar34 ^ _DAT_00157d60;
          if ((bool)(~(auVar36._4_4_ == auVar33._4_4_ && auVar33._0_4_ < auVar36._0_4_ ||
                      auVar33._4_4_ < auVar36._4_4_) & 1)) {
            local_70[lVar18] = local_b0 + lVar18;
          }
          if ((auVar36._12_4_ != auVar33._12_4_ || auVar36._8_4_ <= auVar33._8_4_) &&
              auVar36._12_4_ <= auVar33._12_4_) {
            local_70[lVar18 + 1] = local_b0 + 1 + lVar18;
          }
          lVar18 = lVar18 + 2;
          lVar35 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 2;
          auVar34._8_8_ = lVar35 + 2;
        } while ((uVar29 & 0xfffffffffffffffe) + 2 != lVar18);
      }
    }
    else {
      uVar22 = iVar4 + (uint)(uVar17 < uVar26);
      uVar23 = (ulong)uVar22;
      local_40 = (ulong)uVar17;
      if (uVar22 == 0) {
        bVar32 = false;
      }
      else {
        bVar31 = uVar17 < uVar26;
        bVar32 = false;
        uVar29 = 0;
        begin = size;
        local_68 = peVar20;
        local_58 = size % uVar11;
        do {
          pfVar19 = handle->file;
          *(undefined8 *)(bVar7 - 8) = 0x12737e;
          uVar6 = filemgr_get_sb_bmp_revnum(pfVar19);
          peVar20 = local_68;
          *(short *)(end + uVar29 * 2) = (short)uVar6;
          pfVar19 = handle->file;
          *(undefined8 *)(bVar7 - 8) = 0x127396;
          bVar8 = filemgr_alloc(pfVar19,peVar20);
          local_70[uVar29] = bVar8;
          if ((uVar29 == 0) &&
             (handle->curblock + 1 < bVar8 && handle->curblock != 0xffffffffffffffff)) {
            bVar32 = true;
            if ((int)local_58 != 0) {
              uVar23 = uVar23 + (byte)~bVar31;
              if (!bVar31) {
                bVar31 = true;
              }
              bVar32 = true;
            }
          }
          uVar29 = uVar29 + 1;
          size = begin;
          peVar20 = local_68;
        } while (uVar29 < uVar23);
      }
      uVar11 = local_48;
      handle = local_60;
      bVar8 = local_78;
      if (((int)local_40 == 0) || (bVar32)) {
        if ((local_60->curblock != 0xffffffffffffffff) &&
           (uVar17 = local_60->curpos, uVar17 < (uint)local_78)) {
          pfVar19 = local_60->file;
          lVar18 = local_60->curblock * local_78;
          sVar24 = local_48 - uVar17;
          *(undefined8 *)(bVar7 - 8) = 0x1277b7;
          filemgr_mark_stale(pfVar19,lVar18 + (ulong)uVar17,sVar24);
        }
        bVar8 = bVar8 * *local_70;
        local_40 = 0;
        bVar32 = true;
        local_50 = uVar23;
      }
      else {
        local_50 = uVar23;
        uVar23 = *local_70;
        local_98._0_8_ =
             uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
             (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
             (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 | (uVar23 & 0xff00) << 0x28 |
             uVar23 << 0x38;
        pfVar19 = local_60->file;
        bVar2 = local_60->curblock;
        *(err_log_callback **)(bVar7 - 0x10) = peVar20;
        *(undefined8 *)(bVar7 - 0x18) = 0x127739;
        fVar5 = filemgr_write_offset
                          (pfVar19,bVar2,uVar11,0x10,local_98,false,
                           *(err_log_callback **)(bVar7 - 0x10));
        pvVar27 = local_80;
        if (fVar5 == FDB_RESULT_SUCCESS) {
          pfVar19 = handle->file;
          bVar2 = handle->curblock;
          uVar17 = handle->curpos;
          uVar23 = local_40 & 0xffffffff;
          *(err_log_callback **)(bVar7 - 0x10) = peVar20;
          *(undefined8 *)(bVar7 - 0x18) = 0x1278b8;
          fVar5 = filemgr_write_offset
                            (pfVar19,bVar2,(ulong)uVar17,uVar23,pvVar27,true,
                             *(err_log_callback **)(bVar7 - 0x10));
          if (fVar5 == FDB_RESULT_SUCCESS) {
            size = size - uVar23;
            bVar8 = bVar8 * handle->curblock + (ulong)handle->curpos;
            bVar32 = true;
          }
          else {
            bVar32 = false;
            *(char **)(bVar7 - 0x10) = handle->file->filename;
            *(uint64_t *)(bVar7 - 0x18) = size;
            *(ulong *)(bVar7 - 0x20) = local_40;
            *(bid_t *)(bVar7 - 0x28) = handle->curblock;
            *(char **)(bVar7 - 0x30) =
                 "Error in writing a doc block with id %lu, offset %d, size %lu to a database file \'%s\'"
            ;
            *(undefined8 *)(bVar7 - 0x38) = 0x127907;
            fdb_log_impl(peVar20,2,fVar5,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                         ,"docio_append_doc_raw",0x143,*(char **)(bVar7 - 0x30));
          }
        }
        else {
          bVar32 = false;
          *(char **)(bVar7 - 0x10) = handle->file->filename;
          *(bid_t *)(bVar7 - 0x18) = handle->curblock;
          *(char **)(bVar7 - 0x20) =
               "Error in appending a doc block metadata for a block id %lu into a database file \'%s\'"
          ;
          *(undefined8 *)(bVar7 - 0x28) = 0x127783;
          fdb_log_impl(peVar20,2,fVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_append_doc_raw",0x135,*(char **)(bVar7 - 0x20));
        }
      }
      uVar11 = local_50;
      uVar23 = local_40;
      local_78 = bVar8;
      if (!bVar32) {
        return 0xffffffffffffffff;
      }
    }
    if (uVar11 != 0) {
      local_a0 = uVar11 - 1;
      uVar29 = 0;
      local_50 = uVar11;
      local_68 = peVar20;
      do {
        uVar11 = local_48;
        peVar20 = local_68;
        bVar8 = local_70[uVar29];
        handle->curblock = bVar8;
        uVar1 = *(ushort *)(end + uVar29 * 2);
        handle->cur_bmp_revnum_hash = uVar1;
        local_98._8_2_ = uVar1 << 8 | uVar1 >> 8;
        local_58 = bVar8;
        if (local_31 == '\0') {
LAB_001279b9:
          pfVar19 = handle->file;
          uVar6 = 1;
          puVar21 = &local_32;
        }
        else {
          uVar10 = 0xffffffffffffffff;
          if (uVar29 < local_a0) {
            uVar10 = local_70[uVar29 + 1];
            uVar10 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                     (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                     (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                     (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
          }
          local_98._0_8_ = uVar10;
          if (local_31 == '\0') goto LAB_001279b9;
          pfVar19 = handle->file;
          uVar6 = 0x10;
          puVar21 = local_98;
        }
        *(err_log_callback **)(bVar7 - 0x10) = local_68;
        *(undefined8 *)(bVar7 - 0x18) = 0x1279d7;
        fVar5 = filemgr_write_offset
                          (pfVar19,bVar8,uVar11,uVar6,puVar21,false,
                           *(err_log_callback **)(bVar7 - 0x10));
        uVar28 = local_48;
        uVar10 = local_58;
        pdVar12 = local_60;
        uVar11 = local_a0;
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pcVar25 = 
          "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
          sVar24 = 0x1b3;
          *(char **)(bVar7 - 0x10) = handle->file->filename;
LAB_00127be1:
          puVar15 = (undefined1 *)(bVar7 - 0x18);
          *(ulong *)(bVar7 - 0x18) = local_58;
          goto LAB_00127be4;
        }
        begin = size;
        local_40 = uVar23;
        bVar32 = size < local_48;
        size = size - local_48;
        if (bVar32) {
          if (local_a0 != uVar29) {
            *(undefined8 *)(bVar7 - 8) = 0x127a2c;
            fdb_assert_die("i==block_list_size-1",
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                           ,0x1cb,uVar29,uVar11);
          }
          uVar11 = local_58;
          pdVar12 = local_60;
          peVar20 = local_68;
          size = begin;
          pfVar19 = local_60->file;
          pvVar27 = (void *)((uVar23 & 0xffffffff) + (long)local_80);
          bVar32 = begin == local_48;
          *(err_log_callback **)(bVar7 - 0x10) = local_68;
          *(undefined8 *)(bVar7 - 0x18) = 0x127a64;
          fVar5 = filemgr_write_offset
                            (pfVar19,uVar11,0,size,pvVar27,bVar32,
                             *(err_log_callback **)(bVar7 - 0x10));
          uVar28 = size;
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pfVar19 = pdVar12->file;
            pcVar25 = "Error in writing a doc block with id %lu, size %lu to a database file \'%s\'"
            ;
            sVar24 = 0x1d5;
LAB_00127bd8:
            *(char **)(bVar7 - 8) = pfVar19->filename;
            *(ulong *)(bVar7 - 0x10) = uVar28;
            goto LAB_00127be1;
          }
          pdVar12->curpos = (uint32_t)size;
          uVar17 = pdVar12->file->blocksize;
          magic = pdVar12->file->version;
          *(undefined8 *)(bVar7 - 8) = 0x127a8a;
          bVar32 = ver_non_consecutive_doc(magic);
          uVar23 = local_58;
          if ((size & 0xffffffff) + 0x10 <=
              ((ulong)(bVar32 - 1) | 0xfffffffffffffff0) + (ulong)uVar17) {
            local_d8 = (undefined1  [16])0x0;
            pfVar19 = pdVar12->file;
            *(err_log_callback **)(bVar7 - 0x10) = pdVar12->log_callback;
            *(undefined8 *)(bVar7 - 0x18) = 0x127b15;
            fVar5 = filemgr_write_offset
                              (pfVar19,uVar23,size & 0xffffffff,0x10,local_d8,false,
                               *(err_log_callback **)(bVar7 - 0x10));
            if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00127bef;
          }
        }
        else {
          pfVar19 = local_60->file;
          pvVar27 = (void *)((uVar23 & 0xffffffff) + (long)local_80);
          *(err_log_callback **)(bVar7 - 0x10) = local_68;
          *(undefined8 *)(bVar7 - 0x18) = 0x127ace;
          fVar5 = filemgr_write_offset
                            (pfVar19,uVar10,0,uVar28,pvVar27,true,
                             *(err_log_callback **)(bVar7 - 0x10));
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pfVar19 = pdVar12->file;
            pcVar25 = 
            "Error in writing an entire doc block with id %lu, size %lu to a database file \'%s\'";
            sVar24 = 0x1c2;
            peVar20 = local_68;
            goto LAB_00127bd8;
          }
          pdVar12->curpos = (uint32_t)uVar28;
        }
        uVar23 = (ulong)(uint)((int)local_40 + (int)uVar28);
        uVar29 = uVar29 + 1;
        handle = pdVar12;
      } while (local_50 != uVar29);
    }
  }
  else {
    if (local_31 == '\0') {
      pfVar19 = handle->file;
      bVar7 = handle->curblock;
      puVar21 = &local_32;
      uVar6 = 1;
    }
    else {
      puVar21 = local_98;
      local_98._0_8_ = 0xffffffffffffffff;
      pfVar19 = handle->file;
      bVar7 = handle->curblock;
      uVar6 = 0x10;
    }
    bStack_f0 = 0x127513;
    fVar5 = filemgr_write_offset(pfVar19,bVar7,uVar11,uVar6,puVar21,false,peVar20);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      bStack_f0 = 0x12757a;
      fVar5 = filemgr_write_offset
                        (handle->file,handle->curblock,uVar23,size,local_80,uVar11 - uVar23 == size,
                         peVar20);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        uVar26 = (int)size + handle->curpos;
        handle->curpos = uVar26;
        bVar7 = handle->curblock;
        uVar17 = handle->file->blocksize;
        uStack_e0 = 0x1277f4;
        bVar32 = ver_non_consecutive_doc(handle->file->version);
        if ((ulong)uVar26 + 0x10 <= ((ulong)(bVar32 - 1) | 0xfffffffffffffff0) + (ulong)uVar17) {
          local_d8 = (undefined1  [16])0x0;
          bStack_f0 = 0x127836;
          fVar5 = filemgr_write_offset
                            (handle->file,bVar7,(ulong)uVar26,0x10,local_d8,false,
                             handle->log_callback);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            return 0xffffffffffffffff;
          }
        }
        return local_78 * handle->curblock + uVar23;
      }
      sVar24 = 0xb5;
      bStack_f0 = size;
      puVar14 = &uStack_f8;
      uStack_f8 = uVar23;
LAB_001275bb:
      *(bid_t *)((long)puVar14 + -8) = handle->curblock;
      *(char **)((long)puVar14 + -0x10) =
           "Error in writing a doc block with id %lu, offset %d, size %lu to a database file \'%s\'"
      ;
      *(undefined8 *)((long)puVar14 + -0x18) = 0x1275c5;
      fdb_log_impl(peVar20,2,fVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                   ,"docio_append_doc_raw",sVar24,*(char **)((long)puVar14 + -0x10));
    }
    else {
      pfVar19 = handle->file;
      puVar13 = &uStack_e0;
      sVar24 = 0xac;
LAB_00127542:
      pcVar25 = 
      "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
      *(char **)((long)puVar13 + -8) = pfVar19->filename;
      puVar15 = (undefined1 *)((long)puVar13 + -0x10);
      *(bid_t *)((long)puVar13 + -0x10) = handle->curblock;
LAB_00127be4:
      puVar16 = (undefined8 *)(puVar15 + -8);
      *(char **)(puVar15 + -8) = pcVar25;
LAB_00127be6:
      puVar16[-1] = 0x127beb;
      fdb_log_impl(peVar20,2,fVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                   ,"docio_append_doc_raw",sVar24,(char *)*puVar16);
    }
LAB_00127bef:
    local_78 = 0xffffffffffffffff;
  }
  return local_78;
}

Assistant:

bid_t docio_append_doc_raw(struct docio_handle *handle, uint64_t size, void *buf)
{
    uint32_t offset;
    uint8_t marker[BLK_MARKER_SIZE];
    size_t blocksize = handle->file->blocksize;
    size_t real_blocksize = blocksize;
    size_t remaining_space;
    err_log_callback *log_callback = handle->log_callback;
    bool non_consecutive = ver_non_consecutive_doc(handle->file->version);
    struct docblk_meta blk_meta;

    memset(&blk_meta, 0x0, sizeof(blk_meta));
    blk_meta.marker = BLK_MARKER_DOC;
    (void)blk_meta;

#ifdef __CRC32
    if (non_consecutive) {
        // new version: support non-consecutive document block
        blocksize -= DOCBLK_META_SIZE;
    } else {
        // old version: block marker only
        blocksize -= BLK_MARKER_SIZE;
    }
    memset(marker, BLK_MARKER_DOC, BLK_MARKER_SIZE);
#endif

    if (handle->curblock == BLK_NOT_FOUND) {
        // allocate new block
        handle->cur_bmp_revnum_hash =
            filemgr_get_sb_bmp_revnum(handle->file) & BMP_REVNUM_MASK;
        handle->curblock = filemgr_alloc(handle->file, log_callback);
        handle->curpos = 0;
    }
    if (!filemgr_is_writable(handle->file, handle->curblock)) {
        // mark remaining space in old block as stale
        if (handle->curpos < real_blocksize) {
            // this function will calculate block marker size automatically.
            filemgr_mark_stale(handle->file,
                               real_blocksize * handle->curblock + handle->curpos,
                               blocksize - handle->curpos);
        }
        // allocate new block
        handle->cur_bmp_revnum_hash =
            filemgr_get_sb_bmp_revnum(handle->file) & BMP_REVNUM_MASK;
        handle->curblock = filemgr_alloc(handle->file, log_callback);
        handle->curpos = 0;
    }
    blk_meta.sb_bmp_revnum_hash = _endian_encode(handle->cur_bmp_revnum_hash);

    remaining_space = blocksize - handle->curpos;
    if (size <= remaining_space) {
        fdb_status fs = FDB_RESULT_SUCCESS;
        // simply append to current block
        offset = handle->curpos;

        if (non_consecutive) {
            // set next BID
            blk_meta.next_bid = BLK_NOT_FOUND;
            // write meta
            fs = filemgr_write_offset(handle->file, handle->curblock,
                                      blocksize, sizeof(blk_meta), &blk_meta,
                                      false, log_callback);
        } else {
            fs = _add_blk_marker(handle->file, handle->curblock, blocksize, marker,
                                 log_callback);
        }


        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(log_callback, FDB_LOG_ERROR, fs,
                    "Error in appending a doc block marker for a block id %" _F64
                    " into a database file '%s'", handle->curblock,
                    handle->file->filename);
            return BLK_NOT_FOUND;
        }
        fs = filemgr_write_offset(handle->file, handle->curblock, offset, size,
                                  buf, (size == remaining_space), log_callback);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(log_callback, FDB_LOG_ERROR, fs,
                    "Error in writing a doc block with id %" _F64 ", offset %d, size %"
                    _F64 " to a database file '%s'", handle->curblock, offset, size,
                    handle->file->filename);
            return BLK_NOT_FOUND;
        }
        handle->curpos += size;

        if (_docio_fill_zero(handle, handle->curblock, handle->curpos) !=
            FDB_RESULT_SUCCESS) {
            return BLK_NOT_FOUND;
        }

        return handle->curblock * real_blocksize + offset;

    } else { // insufficient space to fit entire document into current block
        bid_t begin, end, i, startpos;
        bid_t *block_list, block_list_size = 0;
        uint16_t *bmp_revnum_list;
        uint32_t nblock = size / blocksize;
        uint32_t remain = size % blocksize;
        uint64_t remainsize = size;
        fdb_status fs = FDB_RESULT_SUCCESS;

        // as blocks may not be consecutive, we need to maintain
        // the list of BIDs.
        block_list = (bid_t *)alca(bid_t, nblock+1);
        bmp_revnum_list = (uint16_t *)alca(uint16_t, nblock+1);

#ifdef DOCIO_BLOCK_ALIGN
        offset = blocksize - handle->curpos;
        if (remain <= blocksize - handle->curpos &&
            filemgr_alloc_multiple_cond(handle->file, handle->curblock+1,
                                        nblock + ((remain>offset)?1:0), &begin, &end,
                                        log_callback) == handle->curblock+1) {

            // start from current block
            if (begin != (handle->curblock + 1)) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in allocating blocks starting from block id %" _F64
                        " in a database file '%s'", handle->curblock + 1,
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }

            fs = _add_blk_marker(handle->file, handle->curblock, blocksize,
                                 marker, log_callback);
            if (fs != FDB_RESULT_SUCCESS) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in appending a doc block marker for a block id %" _F64
                        " into a database file '%s'", handle->curblock,
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }
            if (offset > 0) {
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          handle->curpos, offset, buf,
                                          true, // mark block as immutable
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing a doc block with id %" _F64 ", offset %d, "
                            "size %" _F64 " to a database file '%s'", handle->curblock,
                            offset, size, handle->file->filename);
                    return BLK_NOT_FOUND;
                }
            }
            remainsize -= offset;

            startpos = handle->curblock * real_blocksize + handle->curpos;
        } else {
            // next block to be allocated is not continuous .. allocate new multiple blocks
            filemgr_alloc_multiple(handle->file, nblock+((remain>0)?1:0),
                                   &begin, &end, log_callback);
            offset = 0;

            startpos = begin * real_blocksize;
        }

#else
        // Simple append mode
        // The given doc is appended at the byte offset right next the last doc.
        // Note that block allocation can be non-consecutive.
        offset = blocksize - handle->curpos;

        if (non_consecutive) {
            // new version: support non-consecutive allocation

            bool new_block = false;
            bool start_from_new_block = false;

            if (remain > offset) {
                // if the current block cannot accommodate the remaining length
                // of the document, allocate an additional block.
                new_block = true;
            }

            block_list_size = nblock + ((new_block)?1:0);
            for (i=0; i<block_list_size; ++i) {
                bmp_revnum_list[i] = filemgr_get_sb_bmp_revnum(handle->file) &
                                     BMP_REVNUM_MASK;
                block_list[i] = filemgr_alloc(handle->file, log_callback);

                if (i == 0 && handle->curblock != BLK_NOT_FOUND &&
                    block_list[i] > handle->curblock+1) {
                    // if the first new allocated block is not consecutive
                    // from the current block, start writing document from
                    // the new block.
                    start_from_new_block = true;
                    // since we won't write into the current block,
                    // allocate one more block if necessary.
                    if (remain && !new_block) {
                        new_block = true;
                        block_list_size++;
                    }
                }
            }

            if (offset > 0 && !start_from_new_block) {
                // start from the current block

                // set next BID
                blk_meta.next_bid = _endian_encode(block_list[0]);
                // write meta
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          blocksize, sizeof(blk_meta), &blk_meta,
                                          false, log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in appending a doc block metadata for a block id %" _F64
                            " into a database file '%s'", handle->curblock,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }

                // write the front part of the doc
                if (offset > 0) {
                    fs = filemgr_write_offset(handle->file, handle->curblock,
                                              handle->curpos, offset, buf,
                                              true, // mark block as immutable
                                              log_callback);
                    if (fs != FDB_RESULT_SUCCESS) {
                        fdb_log(log_callback, FDB_LOG_ERROR, fs,
                                "Error in writing a doc block with id %" _F64 ", offset %d, "
                                "size %" _F64 " to a database file '%s'", handle->curblock,
                                offset, size, handle->file->filename);
                        return BLK_NOT_FOUND;
                    }
                }
                remainsize -= offset;

                startpos = handle->curblock * real_blocksize + handle->curpos;
            } else {
                // mark remaining space in the current block as stale
                if (handle->curblock != BLK_NOT_FOUND &&
                    handle->curpos < real_blocksize) {
                    filemgr_mark_stale(handle->file,
                                       real_blocksize * handle->curblock + handle->curpos,
                                       blocksize - handle->curpos);
                }
                offset = 0;
                startpos = block_list[0] * real_blocksize;
            }

        } else {
            // old version: consecutive allocation only

            if (filemgr_alloc_multiple_cond(handle->file, handle->curblock+1,
                                            nblock + ((remain>offset)?1:0), &begin, &end,
                                            log_callback) == handle->curblock+1) {
                // start from current block
                if (begin != (handle->curblock + 1)) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in allocating blocks starting from block id %" _F64
                            " in a database file '%s'", handle->curblock + 1,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }

                fs = _add_blk_marker(handle->file, handle->curblock, blocksize,
                                     marker, log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in appending a doc block marker for a block id %" _F64
                            " into a database file '%s'", handle->curblock,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                if (offset > 0) {
                    fs = filemgr_write_offset(handle->file, handle->curblock,
                                              handle->curpos, offset, buf,
                                              true, // mark block as immutable
                                              log_callback);
                    if (fs != FDB_RESULT_SUCCESS) {
                        fdb_log(log_callback, FDB_LOG_ERROR, fs,
                                "Error in writing a doc block with id %" _F64 ", offset %d, "
                                "size %" _F64 " to a database file '%s'", handle->curblock,
                                offset, size, handle->file->filename);
                        return BLK_NOT_FOUND;
                    }
                }
                remainsize -= offset;

                startpos = handle->curblock * real_blocksize + handle->curpos;
            } else {
                // next block to be allocated is not continuous
                // mark remaining space in the old block as stale
                if (handle->curblock != BLK_NOT_FOUND &&
                    handle->curpos < real_blocksize) {
                    filemgr_mark_stale(handle->file,
                                       real_blocksize * handle->curblock + handle->curpos,
                                       blocksize - handle->curpos);
                }
                // allocate new multiple blocks
                filemgr_alloc_multiple(handle->file, nblock+((remain>0)?1:0),
                                       &begin, &end, log_callback);
                offset = 0;

                startpos = begin * real_blocksize;
            }

            block_list_size = end - begin + 1;
            for (i=0; i<block_list_size; ++i) {
                block_list[i] = begin+i;
            }

        } // if (non_consecutive)

#endif

        for (i=0; i<block_list_size; ++i) {
            handle->curblock = block_list[i];
            handle->cur_bmp_revnum_hash = bmp_revnum_list[i];
            blk_meta.sb_bmp_revnum_hash = _endian_encode(handle->cur_bmp_revnum_hash);

            if (non_consecutive) {
                if (i < block_list_size - 1) {
                    blk_meta.next_bid = _endian_encode(block_list[i+1]);
                } else {
                    // the last block .. set next BID '0xffff...'
                    memset(&blk_meta.next_bid, 0xff, sizeof(blk_meta.next_bid));
                }
            }

            // write meta (new) or block marker (old)
            if (non_consecutive) {
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          blocksize, sizeof(blk_meta), &blk_meta,
                                          false, log_callback);
            } else {
                fs = _add_blk_marker(handle->file, block_list[i], blocksize, marker,
                                     log_callback);
            }
            if (fs != FDB_RESULT_SUCCESS) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in appending a doc block marker for a block "
                        "id %" _F64 " into a database file '%s'", block_list[i],
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }

            if (remainsize >= blocksize) {
                // write entire block

                fs = filemgr_write_offset(handle->file, block_list[i], 0, blocksize,
                                          (uint8_t *)buf + offset,
                                          true, // mark block as immutable
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing an entire doc block with id %" _F64
                            ", size %" _F64 " to a database file '%s'", block_list[i], blocksize,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                offset += blocksize;
                remainsize -= blocksize;
                handle->curpos = blocksize;

            } else {
                // write rest of document
                fdb_assert(i==block_list_size-1, i, block_list_size-1);

                fs = filemgr_write_offset(handle->file, block_list[i], 0, remainsize,
                                          (uint8_t *)buf + offset,
                                          (remainsize == blocksize),
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing a doc block with id %" _F64 ", "
                            "size %" _F64 " to a database file '%s'", block_list[i], remainsize,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                offset += remainsize;
                handle->curpos = remainsize;

                if (_docio_fill_zero(handle, block_list[i], handle->curpos) !=
                    FDB_RESULT_SUCCESS) {
                    return BLK_NOT_FOUND;
                }
            }
        }

        return startpos;
    }

    return 0;
}